

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmres.h
# Opt level: O1

int GMRES<TPZMatrix<long_double>,TPZFMatrix<long_double>,TPZMatrixSolver<long_double>,TPZFMatrix<long_double>,double>
              (TPZMatrix<long_double> *A,TPZFMatrix<long_double> *x,TPZFMatrix<long_double> *b,
              TPZMatrixSolver<long_double> *M,TPZFMatrix<long_double> *H,int *m,int64_t *max_iter,
              double *tol,TPZFMatrix<long_double> *residual,int FromCurrent)

{
  TPZFMatrix<long_double> *v;
  bool bVar1;
  undefined1 auVar2 [16];
  ulong *puVar3;
  TPZFMatrix<long_double> *pTVar4;
  long lVar5;
  ostream *poVar6;
  bool bVar7;
  longdouble *plVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  ulong *puVar15;
  long lVar16;
  TPZFMatrix<long_double> *pTVar17;
  TPZFMatrix<long_double> *A_00;
  long lVar18;
  long lVar19;
  longdouble lVar20;
  longdouble lVar21;
  longdouble lVar22;
  longdouble in_ST1;
  longdouble lVar23;
  longdouble lVar24;
  longdouble in_ST3;
  longdouble lVar25;
  longdouble lVar26;
  longdouble in_ST5;
  longdouble lVar27;
  longdouble in_ST6;
  longdouble lVar28;
  longdouble in_ST7;
  longdouble lVar29;
  ulong uVar30;
  double dVar31;
  TPZFMatrix<long_double> s;
  TPZFMatrix<long_double> sn;
  TPZFMatrix<long_double> cs;
  long local_488;
  double local_478;
  double local_430;
  TPZFMatrix<long_double> local_390;
  TPZFMatrix<long_double> local_300;
  TPZFMatrix<long_double> local_270;
  TPZFMatrix<long_double> local_1e0;
  TPZFMatrix<long_double> local_150;
  TPZFMatrix<long_double> local_c0;
  
  iVar14 = *m;
  lVar11 = (long)iVar14 + 1;
  local_390.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 1;
  local_390.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_390.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_390.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01845cc0;
  local_390.fElem = (longdouble *)0x0;
  local_390.fGiven = (longdouble *)0x0;
  local_390.fSize = 0;
  local_390.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = lVar11;
  TPZVec<int>::TPZVec(&local_390.fPivot.super_TPZVec<int>,0);
  local_390.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_390.fPivot.super_TPZVec<int>.fStore = local_390.fPivot.fExtAlloc;
  local_390.fPivot.super_TPZVec<int>.fNElements = 0;
  local_390.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_390.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b530;
  local_390.fWork.fStore = (longdouble *)0x0;
  local_390.fWork.fNElements = 0;
  local_390.fWork.fNAlloc = 0;
  if ((int)lVar11 != 0) {
    uVar30 = 0xffffffffffffffff;
    if (-2 < iVar14) {
      uVar30 = lVar11 * 0x10;
    }
    local_390.fElem = (longdouble *)operator_new__(uVar30);
  }
  iVar14 = *m;
  lVar11 = (long)iVar14 + 1;
  local_270.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 1;
  local_270.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_270.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_270.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01845cc0;
  local_270.fElem = (longdouble *)0x0;
  local_270.fGiven = (longdouble *)0x0;
  local_270.fSize = 0;
  local_270.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = lVar11;
  TPZVec<int>::TPZVec(&local_270.fPivot.super_TPZVec<int>,0);
  local_270.fPivot.super_TPZVec<int>.fStore = local_270.fPivot.fExtAlloc;
  local_270.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_270.fPivot.super_TPZVec<int>.fNElements = 0;
  local_270.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_270.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b530;
  local_270.fWork.fStore = (longdouble *)0x0;
  local_270.fWork.fNElements = 0;
  local_270.fWork.fNAlloc = 0;
  if ((int)lVar11 != 0) {
    uVar30 = 0xffffffffffffffff;
    if (-2 < iVar14) {
      uVar30 = lVar11 * 0x10;
    }
    local_270.fElem = (longdouble *)operator_new__(uVar30);
  }
  iVar14 = *m;
  lVar11 = (long)iVar14 + 1;
  local_300.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 1;
  local_300.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_300.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_300.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01845cc0;
  local_300.fElem = (longdouble *)0x0;
  local_300.fGiven = (longdouble *)0x0;
  local_300.fSize = 0;
  local_300.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = lVar11;
  TPZVec<int>::TPZVec(&local_300.fPivot.super_TPZVec<int>,0);
  local_300.fPivot.super_TPZVec<int>.fStore = local_300.fPivot.fExtAlloc;
  local_300.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_300.fPivot.super_TPZVec<int>.fNElements = 0;
  local_300.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_300.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b530;
  local_300.fWork.fStore = (longdouble *)0x0;
  local_300.fWork.fNElements = 0;
  local_300.fWork.fNAlloc = 0;
  if ((int)lVar11 != 0) {
    uVar30 = 0xffffffffffffffff;
    if (-2 < iVar14) {
      uVar30 = lVar11 * 0x10;
    }
    local_300.fElem = (longdouble *)operator_new__(uVar30);
  }
  local_150.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = 0;
  local_150.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 0;
  local_150.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_150.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_150.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01845cc0;
  local_150.fElem = (longdouble *)0x0;
  local_150.fGiven = (longdouble *)0x0;
  local_150.fSize = 0;
  TPZVec<int>::TPZVec(&local_150.fPivot.super_TPZVec<int>,0);
  local_150.fPivot.super_TPZVec<int>.fStore = local_150.fPivot.fExtAlloc;
  local_150.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_150.fPivot.super_TPZVec<int>.fNElements = 0;
  local_150.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_150.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b530;
  local_150.fWork.fStore = (longdouble *)0x0;
  local_150.fWork.fNElements = 0;
  local_150.fWork.fNAlloc = 0;
  local_1e0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = 0;
  local_1e0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 0;
  local_1e0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_1e0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_1e0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01845cc0;
  local_1e0.fElem = (longdouble *)0x0;
  local_1e0.fGiven = (longdouble *)0x0;
  local_1e0.fSize = 0;
  TPZVec<int>::TPZVec(&local_1e0.fPivot.super_TPZVec<int>,0);
  local_1e0.fPivot.super_TPZVec<int>.fStore = local_1e0.fPivot.fExtAlloc;
  local_1e0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_1e0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_1e0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_1e0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b530;
  local_1e0.fWork.fStore = (longdouble *)0x0;
  local_1e0.fWork.fNElements = 0;
  local_1e0.fWork.fNAlloc = 0;
  local_c0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = 0;
  local_c0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 0;
  local_c0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_c0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_c0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01845cc0;
  local_c0.fElem = (longdouble *)0x0;
  local_c0.fGiven = (longdouble *)0x0;
  local_c0.fSize = 0;
  TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
  local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
  local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b530;
  local_c0.fWork.fStore = (longdouble *)0x0;
  local_c0.fWork.fNElements = 0;
  local_c0.fWork.fNAlloc = 0;
  A_00 = residual;
  if (residual == (TPZFMatrix<long_double> *)0x0) {
    A_00 = &local_c0;
  }
  (*(M->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])(M,b,A_00,0);
  Dot<long_double>(A_00,A_00);
  lVar24 = in_ST7;
  sqrtl();
  if (FromCurrent == 0) {
    (*(x->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
              ();
    TPZFMatrix<long_double>::operator=(A_00,b);
  }
  else {
    lVar24 = in_ST7;
    (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x27])(A,x,b,A_00,0);
  }
  (*(M->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])(M,A_00,&local_1e0,0);
  TPZFMatrix<long_double>::operator=(A_00,&local_1e0);
  lVar25 = lVar24;
  Dot<long_double>(A_00,A_00);
  lVar26 = lVar25;
  sqrtl();
  local_430 = (double)in_ST3;
  lVar23 = lVar26;
  Dot<long_double>(A_00,A_00);
  uVar30 = -(ulong)((double)in_ST1 == 0.0);
  dVar31 = (double)(~uVar30 & (ulong)(double)in_ST1 | uVar30 & 0x3ff0000000000000);
  lVar27 = lVar23;
  sqrtl();
  local_478 = (double)in_ST5 / dVar31;
  if (*tol < local_478) {
    iVar14 = *m;
    uVar10 = (ulong)(iVar14 + 1);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar10;
    uVar30 = 0xffffffffffffffff;
    if (SUB168(auVar2 * ZEXT816(0x90),8) == 0) {
      uVar30 = SUB168(auVar2 * ZEXT816(0x90),0) | 8;
    }
    puVar3 = (ulong *)operator_new__(uVar30);
    *puVar3 = uVar10;
    if (iVar14 + 1 != 0) {
      lVar11 = 0;
      puVar15 = puVar3;
      do {
        puVar15[2] = 0;
        puVar15[3] = 0;
        *(undefined2 *)(puVar15 + 4) = 0;
        puVar15[1] = (ulong)&PTR__TPZFMatrix_01845cc0;
        puVar15[5] = 0;
        puVar15[6] = 0;
        puVar15[7] = 0;
        TPZVec<int>::TPZVec((TPZVec<int> *)(puVar15 + 8),0);
        puVar15[8] = (ulong)&PTR__TPZManVector_0183cde8;
        puVar15[9] = (ulong)(puVar15 + 0xc);
        puVar15[10] = 0;
        puVar15[0xb] = 0;
        puVar15[0xf] = (ulong)&PTR__TPZVec_0183b530;
        puVar15[0x10] = 0;
        puVar15[0x11] = 0;
        puVar15[0x12] = 0;
        lVar11 = lVar11 + -0x90;
        puVar15 = puVar15 + 0x12;
      } while (-lVar11 != uVar10 * 0x90);
    }
    v = (TPZFMatrix<long_double> *)(puVar3 + 1);
    pTVar4 = &local_c0;
    if (residual != (TPZFMatrix<long_double> *)0x0) {
      pTVar4 = residual;
    }
    lVar11 = 1;
    do {
      if (*max_iter < lVar11) {
        *tol = local_478;
        uVar30 = *puVar3;
        if (uVar30 != 0) {
          lVar11 = uVar30 * 0x90;
          do {
            TPZFMatrix<long_double>::~TPZFMatrix
                      ((TPZFMatrix<long_double> *)((long)puVar3 + lVar11 + -0x88));
            lVar11 = lVar11 + -0x90;
          } while (lVar11 != 0);
        }
        operator_delete__(puVar3,uVar30 * 0x90 + 8);
        iVar14 = 1;
        break;
      }
      lVar12 = (pTVar4->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
      (*(v->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd]
      )(v,lVar12,1);
      if (0 < lVar12) {
        plVar8 = pTVar4->fElem;
        uVar30 = puVar3[5];
        lVar9 = 0;
        do {
          *(longdouble *)(uVar30 + lVar9) =
               (longdouble)((double)*(longdouble *)((long)plVar8 + lVar9) * (1.0 / local_430));
          lVar9 = lVar9 + 0x10;
          lVar12 = lVar12 + -1;
        } while (lVar12 != 0);
      }
      lVar12 = local_390.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow;
      plVar8 = local_390.fElem;
      if (0 < local_390.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow) {
        do {
          *plVar8 = (longdouble)0;
          lVar12 = lVar12 + -1;
          plVar8 = plVar8 + 1;
          lVar27 = lVar23;
        } while (lVar12 != 0);
      }
      *local_390.fElem = (longdouble)local_430;
      bVar7 = *max_iter < lVar11 || *m < 1;
      if (*max_iter >= lVar11 && *m >= 1) {
        local_488 = 1;
        lVar16 = 0;
        lVar12 = lVar11;
        lVar9 = 0;
LAB_00c5156c:
        (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x25])
                  (A,v + lVar9,&local_150,0);
        (*(M->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])(M,&local_150,&local_1e0,0);
        lVar18 = 0;
        lVar11 = 0;
        pTVar17 = v;
        lVar20 = in_ST6;
        lVar21 = in_ST7;
        lVar28 = lVar27;
        do {
          in_ST7 = lVar26;
          in_ST6 = lVar25;
          lVar22 = lVar24;
          Dot<long_double>(&local_1e0,pTVar17);
          if (((H->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow <= lVar11) ||
             ((H->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= lVar9)) {
            TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar19 = (H->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
          *(longdouble *)((long)H->fElem + lVar18 + lVar16 * lVar19) = lVar20;
          if ((lVar19 <= lVar11) ||
             ((H->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= lVar9)) {
            TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar29 = lVar28;
          TPZFMatrix<long_double>::ZAXPY
                    (&local_1e0,
                     -*(longdouble *)
                       ((long)H->fElem +
                       lVar18 + (H->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow * lVar16)
                     ,pTVar17);
          lVar11 = lVar11 + 1;
          pTVar17 = pTVar17 + 1;
          lVar18 = lVar18 + 0x10;
          lVar20 = lVar21;
          lVar21 = lVar22;
          lVar24 = in_ST6;
          lVar25 = in_ST7;
          lVar26 = lVar23;
          lVar23 = lVar27;
          lVar27 = lVar28;
          lVar28 = lVar29;
        } while (local_488 != lVar11);
        Dot<long_double>(&local_1e0,&local_1e0);
        sqrtl();
        lVar18 = lVar9 + 1;
        if (((H->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow <= lVar18) ||
           ((H->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= lVar9)) {
          TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        H->fElem[(H->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow * lVar9 + lVar18] =
             lVar22;
        pTVar17 = v + lVar18;
        TPZFMatrix<long_double>::operator=(pTVar17,&local_1e0);
        if (((H->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow <= lVar18) ||
           ((H->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= lVar9)) {
          TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        (*(pTVar17->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable[0x26])(pTVar17);
        if (lVar9 != 0) {
          lVar19 = 1;
          lVar11 = 0;
          do {
            if (((H->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow <= lVar19 + -1) ||
               ((H->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= lVar9)) {
              TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds")
              ;
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar5 = (H->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
            lVar13 = lVar16 * lVar5;
            plVar8 = H->fElem;
            if ((lVar5 <= lVar19) ||
               ((H->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= lVar9)) {
              TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds")
              ;
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar5 = (H->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow * lVar16;
            lVar24 = *(longdouble *)((long)local_270.fElem + lVar11);
            lVar25 = *(longdouble *)((long)plVar8 + lVar11 + lVar13);
            lVar26 = *(longdouble *)((long)local_300.fElem + lVar11);
            lVar23 = *(longdouble *)((long)H->fElem + lVar11 + 0x10 + lVar5);
            *(longdouble *)((long)H->fElem + lVar11 + 0x10 + lVar5) =
                 lVar24 * lVar23 - lVar26 * lVar25;
            *(longdouble *)((long)plVar8 + lVar11 + lVar13) = lVar24 * lVar25 + lVar26 * lVar23;
            lVar11 = lVar11 + 0x10;
            lVar19 = lVar19 + 1;
          } while (lVar16 != lVar11);
        }
        if (((H->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow <= lVar9) ||
           ((H->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= lVar9)) {
          TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar11 = (H->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
        if ((lVar11 <= lVar18) ||
           ((H->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= lVar9)) {
          TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        GeneratePlaneRotation<long_double>
                  (H->fElem + lVar11 * lVar9 + lVar9,
                   H->fElem +
                   (H->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow * lVar9 + lVar18,
                   local_270.fElem + lVar9,local_300.fElem + lVar9);
        if (((H->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow <= lVar9) ||
           ((H->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= lVar9)) {
          TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar11 = (H->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
        plVar8 = H->fElem;
        if ((lVar11 <= lVar18) ||
           ((H->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= lVar9)) {
          TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar19 = (H->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow * lVar9;
        lVar24 = local_270.fElem[lVar9];
        lVar25 = plVar8[lVar11 * lVar9 + lVar9];
        lVar26 = local_300.fElem[lVar9];
        lVar23 = H->fElem[lVar19 + lVar18];
        H->fElem[lVar19 + lVar18] = lVar24 * lVar23 - lVar26 * lVar25;
        plVar8[lVar11 * lVar9 + lVar9] = lVar24 * lVar25 + lVar26 * lVar23;
        lVar24 = local_270.fElem[lVar9];
        lVar25 = local_300.fElem[lVar9];
        lVar26 = local_390.fElem[lVar18];
        lVar23 = lVar24 * lVar26 - lVar25 * local_390.fElem[lVar9];
        local_390.fElem[lVar18] = lVar23;
        local_390.fElem[lVar9] = lVar24 * local_390.fElem[lVar9] + lVar25 * lVar26;
        local_478 = (double)ABS(lVar23) / dVar31;
        lVar24 = in_ST7;
        lVar25 = in_ST7;
        lVar26 = in_ST7;
        lVar23 = in_ST7;
        lVar27 = in_ST7;
        if (*tol <= local_478) goto code_r0x00c51ae5;
        Update<TPZFMatrix<long_double>,TPZFMatrix<long_double>>(x,lVar9,H,&local_390,v);
        *tol = local_478;
        *max_iter = lVar12;
        uVar30 = *puVar3;
        if (uVar30 != 0) {
          lVar11 = uVar30 * 0x90;
          do {
            TPZFMatrix<long_double>::~TPZFMatrix
                      ((TPZFMatrix<long_double> *)((long)puVar3 + lVar11 + -0x88));
            lVar11 = lVar11 + -0x90;
          } while (lVar11 != 0);
        }
        operator_delete__(puVar3,uVar30 * 0x90 + 8);
        lVar11 = lVar12;
      }
LAB_00c51bb1:
      bVar1 = false;
      lVar20 = in_ST7;
      if (bVar7) {
        Update<TPZFMatrix<long_double>,TPZFMatrix<long_double>>(x,(long)*m + -1,H,&local_390,v);
        (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x27])(A,x,b,A_00,0);
        (*(M->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])(M,A_00,A_00,0);
        in_ST6 = lVar24;
        lVar20 = lVar25;
        lVar24 = lVar26;
        lVar25 = lVar23;
        lVar26 = lVar27;
        lVar23 = lVar27;
        Dot<long_double>(A_00,A_00);
        lVar27 = lVar23;
        sqrtl();
        local_430 = (double)in_ST7;
        local_478 = local_430 / dVar31;
        bVar1 = true;
        if (local_478 < *tol) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"iter ",5);
          poVar6 = std::ostream::_M_insert<long>((long)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," - ",3);
          poVar6 = std::ostream::_M_insert<double>(local_478);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          *tol = local_478;
          *max_iter = lVar11;
          uVar30 = *puVar3;
          if (uVar30 != 0) {
            lVar12 = uVar30 * 0x90;
            do {
              TPZFMatrix<long_double>::~TPZFMatrix
                        ((TPZFMatrix<long_double> *)((long)puVar3 + lVar12 + -0x88));
              lVar12 = lVar12 + -0x90;
            } while (lVar12 != 0);
          }
          operator_delete__(puVar3,uVar30 * 0x90 + 8);
          bVar1 = false;
        }
      }
      iVar14 = 0;
      in_ST7 = lVar20;
    } while (bVar1);
  }
  else {
    *tol = local_478;
    TPZFMatrix<long_double>::operator+=(x,&A_00->super_TPZMatrix<long_double>);
    *max_iter = 0;
    iVar14 = 0;
  }
  TPZFMatrix<long_double>::~TPZFMatrix(&local_c0);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_1e0);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_150);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_300);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_270);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_390);
  return iVar14;
code_r0x00c51ae5:
  lVar11 = lVar12 + 1;
  bVar1 = *max_iter <= lVar12;
  bVar7 = bVar1 || *m <= lVar18;
  local_488 = local_488 + 1;
  lVar16 = lVar16 + 0x10;
  lVar12 = lVar11;
  lVar9 = lVar18;
  if (bVar1 || *m <= lVar18) goto LAB_00c51bb1;
  goto LAB_00c5156c;
}

Assistant:

int 
GMRES( Operator &A, Vector &x, const Vector &b,
	  Preconditioner &M, Matrix &H, int &m, int64_t &max_iter,
	  Real &tol, Vector *residual,const int FromCurrent)
{
	Real resid;
	int64_t j = 1, k;
	Vector s(m+1), cs(m+1), sn(m+1), w1,w;
	
	//  Real normb = norm(M.Solve(b));
	Vector resbackup;
	Vector *res = residual;
	if(!res) res = &resbackup;
	Vector &r = *res;
    M.Solve(b,r);
	Real normb = TPZExtractVal::val(Norm(r));	//  Vector r = b - A*x;
	if(FromCurrent) 
    {
        A.MultAdd(x,b,r,-1.,1.);
    } 
    else 
    {
		x.Zero();
		r = b;
	}
	M.Solve(r,w);
	r=w;
	Real beta = TPZExtractVal::val(Norm(r));
	
	if (normb == 0.0)
		normb = 1;
	
	if ((resid = ((Real)TPZExtractVal::val(Norm(r))) / normb) <= tol) {
		tol = resid;
		x+=r;
		max_iter = 0;
		return 0;
	}
	
	Vector *v = new Vector[m+1];
	
	while (j <= max_iter) {
        int64_t rows = r.Rows();
        v[0].Resize(rows,1);
        for (int64_t i=0; i<rows; i++) {
            v[0](i) = TPZExtractVal::val(r(i)) * ((Real)(1.0/beta));
        }
        int64_t srows = s.Rows();
        for (int64_t i=0; i<srows; i++) {
            s(i) = REAL(0.);
        }
//		v[0] = r * (REAL(1.0 / beta));    // ??? r / beta
//		s = REAL(0.0);
		s(0) = beta;
		
		for (int64_t i = 0; i < m && j <= max_iter; i++, j++) {
			A.Multiply(v[i],w1);
			M.Solve(w1,w);
			for (k = 0; k <= i; k++) {
				H(k, i) = Dot(w, v[k]);
				w.ZAXPY(-H(k, i), v[k]);
			}
			H(i+1, i) = Norm(w);
			v[i+1] = w;
			v[i+1] *= (1.0)/TPZExtractVal::val(H(i+1,i));
			
			for (k = 0; k < i; k++)
				ApplyPlaneRotation(H(k,i), H(k+1,i), cs(k), sn(k));
			
			GeneratePlaneRotation(H(i,i), H(i+1,i), cs(i), sn(i));
			ApplyPlaneRotation(H(i,i), H(i+1,i), cs(i), sn(i));
			ApplyPlaneRotation(s(i), s(i+1), cs(i), sn(i));
			resid = ((Real)fabs(s(i+1)))/normb;
			if (resid < tol) {
				Update(x, i, H, s, v);
				tol = resid;
				max_iter = j;
				delete [] v;
				return 0;
			}
		}
		Update(x, m - 1, H, s, v);
		A.MultAdd(x,b,r,-1.,1.);
		M.Solve(r,r);
		beta = TPZExtractVal::val(Norm(r));
        resid = beta/normb;
		if (resid < tol) {
            std::cout << "iter " << j << " - " << resid << std::endl;
			tol = resid;
			max_iter = j;
			delete [] v;
			return 0;
		}
	}
	
	tol = resid;
	delete [] v;
	return 1;
}